

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scale_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Scale_x86::forward_inplace
          (Scale_x86 *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_top_blobs,
          Option *opt)

{
  float fVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  void *pvVar8;
  int *piVar9;
  float *pfVar10;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long *in_RDI;
  int remain_1;
  float s_1;
  float *ptr_7;
  int q_3;
  float *scale_ptr_1;
  int remain;
  float bias_1;
  float s;
  float *ptr_6;
  int q_2;
  float *bias_ptr;
  float *scale_ptr;
  int size;
  int channels;
  int h;
  int w;
  __m128 _p_5;
  int i_5;
  __m128 _s_5;
  float *ptr_5;
  int q_1;
  __m128 _p_4;
  int i_4;
  __m128 _bias_2;
  __m128 _s_4;
  float *ptr_4;
  int q;
  int size_1;
  int channels_1;
  int h_2;
  int w_3;
  __m128 _p_3;
  int j_1;
  __m128 _s_3;
  float *ptr_3;
  int i_3;
  __m128 _p_2;
  int j;
  __m128 _bias_1;
  __m128 _s_2;
  float *ptr_2;
  int i_2;
  int h_1;
  int w_2;
  __m128 _s_1;
  __m128 _p_1;
  float *ptr_1;
  int i_1;
  __m128 _bias;
  __m128 _s;
  __m128 _p;
  float *ptr;
  int i;
  float *bias;
  float *scale;
  int w_1;
  int elempack;
  int dims;
  Mat *scale_blob;
  Mat *bottom_top_blob;
  undefined8 in_stack_fffffffffffff9e0;
  Mat *this_00;
  Mat *in_stack_fffffffffffff9e8;
  int local_5f8;
  Mat local_5f0;
  float *local_5a8;
  int local_59c;
  float *local_598;
  int local_58c;
  float local_588;
  float local_584;
  Mat local_580;
  float *local_538;
  int local_52c;
  float *local_528;
  float *local_520;
  int local_518;
  int local_514;
  int local_510;
  int local_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  int local_4ec;
  undefined8 local_4e8;
  Option *in_stack_fffffffffffffb20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffb28;
  Scale *in_stack_fffffffffffffb30;
  Mat *local_488;
  int local_47c;
  undefined8 local_478;
  undefined8 uStack_470;
  int local_45c;
  Mat local_420;
  float *local_3d8;
  int local_3cc;
  int local_3c8;
  int local_3c4;
  int local_3c0;
  int local_3bc;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  int local_39c;
  undefined8 local_398;
  undefined8 uStack_390;
  float *local_388;
  int local_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  int local_35c;
  undefined8 local_358;
  undefined8 uStack_350;
  undefined8 local_348;
  undefined8 uStack_340;
  float *local_330;
  int local_324;
  int local_320;
  int local_31c;
  undefined8 local_318;
  undefined8 uStack_310;
  undefined8 local_308;
  undefined8 uStack_300;
  float *local_2f8;
  int local_2ec;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined8 local_2d8;
  undefined8 uStack_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  float *local_2b0;
  int local_2a4;
  float *local_2a0;
  float *local_298;
  int local_28c;
  int local_288;
  int local_284;
  reference local_280;
  reference local_278;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_268;
  int local_254;
  Mat *local_250;
  float *local_248;
  float *local_240;
  float *local_238;
  float *local_230;
  float *local_228;
  float *local_220;
  float *local_218;
  float *local_210;
  float *local_208;
  float *local_200;
  float *local_1f8;
  float *local_1f0;
  float *local_1e8;
  float *local_1e0;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8;
  float fStack_1c4;
  float fStack_1c0;
  float fStack_1bc;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  undefined8 local_198;
  undefined8 uStack_190;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  void *local_b8;
  int *piStack_b0;
  Mat *local_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  float *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  float *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  float *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  float *local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  float *local_8;
  
  local_268 = in_RSI;
  local_278 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_280 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_268,1);
  local_284 = local_278->dims;
  local_288 = local_278->elempack;
  if (local_288 == 4) {
    if (local_284 == 1) {
      local_28c = local_278->w;
      local_298 = ncnn::Mat::operator_cast_to_float_(local_280);
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_2ec = 0; local_2ec < local_28c; local_2ec = local_2ec + 1) {
          local_2f8 = ncnn::Mat::operator_cast_to_float_(local_278);
          local_2f8 = local_2f8 + (local_2ec << 2);
          uVar2 = *(undefined8 *)local_2f8;
          uVar3 = *(undefined8 *)(local_2f8 + 2);
          local_200 = local_298 + (local_2ec << 2);
          local_318 = *(undefined8 *)local_200;
          uStack_310 = *(undefined8 *)(local_200 + 2);
          local_e8._0_4_ = (float)uVar2;
          local_e8._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_e0._0_4_ = (float)uVar3;
          uStack_e0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_f8._0_4_ = (float)local_318;
          local_f8._4_4_ = (float)((ulong)local_318 >> 0x20);
          uStack_f0._0_4_ = (float)uStack_310;
          uStack_f0._4_4_ = (float)((ulong)uStack_310 >> 0x20);
          local_308 = CONCAT44(local_e8._4_4_ * local_f8._4_4_,(float)local_e8 * (float)local_f8);
          uStack_300 = CONCAT44(uStack_e0._4_4_ * uStack_f0._4_4_,
                                (float)uStack_e0 * (float)uStack_f0);
          local_38 = local_308;
          uStack_30 = uStack_300;
          *(undefined8 *)local_2f8 = local_308;
          *(undefined8 *)(local_2f8 + 2) = uStack_300;
          local_1f8 = local_2f8;
          local_f8 = local_318;
          uStack_f0 = uStack_310;
          local_e8 = uVar2;
          uStack_e0 = uVar3;
          local_20 = local_2f8;
        }
      }
      else {
        local_2a0 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
        for (local_2a4 = 0; local_2a4 < local_28c; local_2a4 = local_2a4 + 1) {
          local_2b0 = ncnn::Mat::operator_cast_to_float_(local_278);
          local_2b0 = local_2b0 + (local_2a4 << 2);
          uVar2 = *(undefined8 *)local_2b0;
          uVar3 = *(undefined8 *)(local_2b0 + 2);
          local_1e8 = local_298 + (local_2a4 << 2);
          local_2d8 = *(undefined8 *)local_1e8;
          uStack_2d0 = *(undefined8 *)(local_1e8 + 2);
          local_1f0 = local_2a0 + (local_2a4 << 2);
          local_2e8 = *(undefined8 *)local_1f0;
          uStack_2e0 = *(undefined8 *)(local_1f0 + 2);
          local_c8._0_4_ = (float)uVar2;
          local_c8._4_4_ = (float)((ulong)uVar2 >> 0x20);
          uStack_c0._0_4_ = (float)uVar3;
          uStack_c0._4_4_ = (float)((ulong)uVar3 >> 0x20);
          local_d8._0_4_ = (float)local_2d8;
          local_d8._4_4_ = (float)((ulong)local_2d8 >> 0x20);
          uStack_d0._0_4_ = (float)uStack_2d0;
          uStack_d0._4_4_ = (float)((ulong)uStack_2d0 >> 0x20);
          local_188 = (float)local_c8 * (float)local_d8;
          fStack_184 = local_c8._4_4_ * local_d8._4_4_;
          fStack_180 = (float)uStack_c0 * (float)uStack_d0;
          fStack_17c = uStack_c0._4_4_ * uStack_d0._4_4_;
          local_198._0_4_ = (float)local_2e8;
          local_198._4_4_ = (float)((ulong)local_2e8 >> 0x20);
          uStack_190._0_4_ = (float)uStack_2e0;
          uStack_190._4_4_ = (float)((ulong)uStack_2e0 >> 0x20);
          local_2c8 = CONCAT44(fStack_184 + local_198._4_4_,local_188 + (float)local_198);
          uStack_2c0 = CONCAT44(fStack_17c + uStack_190._4_4_,fStack_180 + (float)uStack_190);
          local_18 = local_2c8;
          uStack_10 = uStack_2c0;
          *(undefined8 *)local_2b0 = local_2c8;
          *(undefined8 *)(local_2b0 + 2) = uStack_2c0;
          local_1e0 = local_2b0;
          local_198 = local_2e8;
          uStack_190 = uStack_2e0;
          local_d8 = local_2d8;
          uStack_d0 = uStack_2d0;
          local_c8 = uVar2;
          uStack_c0 = uVar3;
          local_8 = local_2b0;
        }
      }
    }
    if (local_284 == 2) {
      local_31c = local_278->w;
      local_320 = local_278->h;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_37c = 0; local_37c < local_320; local_37c = local_37c + 1) {
          local_388 = ncnn::Mat::row(local_278,local_37c);
          local_220 = ncnn::Mat::operator_cast_to_float_(local_280);
          local_220 = local_220 + (local_37c << 2);
          local_398 = *(undefined8 *)local_220;
          uStack_390 = *(undefined8 *)(local_220 + 2);
          for (local_39c = 0; local_39c < local_31c; local_39c = local_39c + 1) {
            local_228 = local_388;
            uVar2 = *(undefined8 *)local_388;
            uVar3 = *(undefined8 *)(local_388 + 2);
            local_128._0_4_ = (float)uVar2;
            local_128._4_4_ = (float)((ulong)uVar2 >> 0x20);
            uStack_120._0_4_ = (float)uVar3;
            uStack_120._4_4_ = (float)((ulong)uVar3 >> 0x20);
            local_138._0_4_ = (float)local_398;
            local_138._4_4_ = (float)((ulong)local_398 >> 0x20);
            uStack_130._0_4_ = (float)uStack_390;
            uStack_130._4_4_ = (float)((ulong)uStack_390 >> 0x20);
            local_3b8 = CONCAT44(local_128._4_4_ * local_138._4_4_,
                                 (float)local_128 * (float)local_138);
            uStack_3b0 = CONCAT44(uStack_120._4_4_ * uStack_130._4_4_,
                                  (float)uStack_120 * (float)uStack_130);
            local_60 = local_388;
            local_78 = local_3b8;
            uStack_70 = uStack_3b0;
            *(undefined8 *)local_388 = local_3b8;
            *(undefined8 *)(local_388 + 2) = uStack_3b0;
            local_388 = local_388 + 4;
            local_138 = local_398;
            uStack_130 = uStack_390;
            local_128 = uVar2;
            uStack_120 = uVar3;
          }
        }
      }
      else {
        for (local_324 = 0; local_324 < local_320; local_324 = local_324 + 1) {
          local_330 = ncnn::Mat::row(local_278,local_324);
          local_208 = ncnn::Mat::operator_cast_to_float_(local_280);
          local_208 = local_208 + (local_324 << 2);
          local_348 = *(undefined8 *)local_208;
          uStack_340 = *(undefined8 *)(local_208 + 2);
          local_210 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_210 = local_210 + (local_324 << 2);
          local_358 = *(undefined8 *)local_210;
          uStack_350 = *(undefined8 *)(local_210 + 2);
          for (local_35c = 0; local_35c < local_31c; local_35c = local_35c + 1) {
            local_218 = local_330;
            uVar2 = *(undefined8 *)local_330;
            uVar3 = *(undefined8 *)(local_330 + 2);
            local_108._0_4_ = (float)uVar2;
            local_108._4_4_ = (float)((ulong)uVar2 >> 0x20);
            uStack_100._0_4_ = (float)uVar3;
            uStack_100._4_4_ = (float)((ulong)uVar3 >> 0x20);
            local_118._0_4_ = (float)local_348;
            local_118._4_4_ = (float)((ulong)local_348 >> 0x20);
            uStack_110._0_4_ = (float)uStack_340;
            uStack_110._4_4_ = (float)((ulong)uStack_340 >> 0x20);
            local_1a8 = (float)local_108 * (float)local_118;
            fStack_1a4 = local_108._4_4_ * local_118._4_4_;
            fStack_1a0 = (float)uStack_100 * (float)uStack_110;
            fStack_19c = uStack_100._4_4_ * uStack_110._4_4_;
            local_1b8._0_4_ = (float)local_358;
            local_1b8._4_4_ = (float)((ulong)local_358 >> 0x20);
            uStack_1b0._0_4_ = (float)uStack_350;
            uStack_1b0._4_4_ = (float)((ulong)uStack_350 >> 0x20);
            local_378 = CONCAT44(fStack_1a4 + local_1b8._4_4_,local_1a8 + (float)local_1b8);
            uStack_370 = CONCAT44(fStack_19c + uStack_1b0._4_4_,fStack_1a0 + (float)uStack_1b0);
            local_40 = local_330;
            local_58 = local_378;
            uStack_50 = uStack_370;
            *(undefined8 *)local_330 = local_378;
            *(undefined8 *)(local_330 + 2) = uStack_370;
            local_330 = local_330 + 4;
            local_1b8 = local_358;
            uStack_1b0 = uStack_350;
            local_118 = local_348;
            uStack_110 = uStack_340;
            local_108 = uVar2;
            uStack_100 = uVar3;
          }
        }
      }
    }
    if (local_284 == 3) {
      local_3bc = local_278->w;
      local_3c0 = local_278->h;
      local_3c4 = local_278->c;
      local_3c8 = local_3bc * local_3c0;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
        for (local_47c = 0; local_47c < local_3c4; local_47c = local_47c + 1) {
          this_00 = (Mat *)&stack0xfffffffffffffb30;
          ncnn::Mat::channel(in_stack_fffffffffffff9e8,(int)((ulong)this_00 >> 0x20));
          local_488 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
          ncnn::Mat::~Mat((Mat *)0x503f93);
          in_stack_fffffffffffff9e8 = local_488;
          local_248 = ncnn::Mat::operator_cast_to_float_(local_280);
          local_248 = local_248 + (local_47c << 2);
          local_4e8 = *(undefined8 *)local_248;
          uVar2 = *(undefined8 *)(local_248 + 2);
          for (local_4ec = 0; local_4ec < local_3c8; local_4ec = local_4ec + 1) {
            local_250 = local_488;
            pvVar8 = local_488->data;
            piVar9 = local_488->refcount;
            local_168._0_4_ = SUB84(pvVar8,0);
            local_168._4_4_ = (float)((ulong)pvVar8 >> 0x20);
            uStack_160._0_4_ = SUB84(piVar9,0);
            uStack_160._4_4_ = (float)((ulong)piVar9 >> 0x20);
            local_178._0_4_ = (float)local_4e8;
            local_178._4_4_ = (float)((ulong)local_4e8 >> 0x20);
            uStack_170._0_4_ = (float)uVar2;
            uStack_170._4_4_ = (float)((ulong)uVar2 >> 0x20);
            local_508 = (void *)CONCAT44(local_168._4_4_ * local_178._4_4_,
                                         (float)local_168 * (float)local_178);
            uStack_500 = (int *)CONCAT44(uStack_160._4_4_ * uStack_170._4_4_,
                                         (float)uStack_160 * (float)uStack_170);
            local_a0 = local_488;
            local_b8 = local_508;
            piStack_b0 = uStack_500;
            local_488->data = local_508;
            local_488->refcount = uStack_500;
            local_488 = (Mat *)&local_488->elemsize;
            local_178 = local_4e8;
            uStack_170 = uVar2;
            local_168 = pvVar8;
            uStack_160 = piVar9;
          }
        }
      }
      else {
        for (local_3cc = 0; local_3cc < local_3c4; local_3cc = local_3cc + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffff9e8,
                             (int)((ulong)in_stack_fffffffffffff9e0 >> 0x20));
          pfVar10 = ncnn::Mat::operator_cast_to_float_(&local_420);
          ncnn::Mat::~Mat((Mat *)0x503d63);
          local_3d8 = pfVar10;
          local_230 = ncnn::Mat::operator_cast_to_float_(local_280);
          local_230 = local_230 + (local_3cc << 2);
          uVar2 = *(undefined8 *)local_230;
          uVar3 = *(undefined8 *)(local_230 + 2);
          local_238 = ncnn::Mat::operator_cast_to_float_
                                ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
          local_238 = local_238 + (local_3cc << 2);
          uVar4 = *(undefined8 *)local_238;
          uVar5 = *(undefined8 *)(local_238 + 2);
          for (local_45c = 0; local_45c < local_3c8; local_45c = local_45c + 1) {
            local_240 = local_3d8;
            uVar6 = *(undefined8 *)local_3d8;
            uVar7 = *(undefined8 *)(local_3d8 + 2);
            local_148._0_4_ = (float)uVar6;
            local_148._4_4_ = (float)((ulong)uVar6 >> 0x20);
            uStack_140._0_4_ = (float)uVar7;
            uStack_140._4_4_ = (float)((ulong)uVar7 >> 0x20);
            local_158._0_4_ = (float)uVar2;
            local_158._4_4_ = (float)((ulong)uVar2 >> 0x20);
            uStack_150._0_4_ = (float)uVar3;
            uStack_150._4_4_ = (float)((ulong)uVar3 >> 0x20);
            local_1c8 = (float)local_148 * (float)local_158;
            fStack_1c4 = local_148._4_4_ * local_158._4_4_;
            fStack_1c0 = (float)uStack_140 * (float)uStack_150;
            fStack_1bc = uStack_140._4_4_ * uStack_150._4_4_;
            local_1d8._0_4_ = (float)uVar4;
            local_1d8._4_4_ = (float)((ulong)uVar4 >> 0x20);
            uStack_1d0._0_4_ = (float)uVar5;
            uStack_1d0._4_4_ = (float)((ulong)uVar5 >> 0x20);
            local_478 = CONCAT44(fStack_1c4 + local_1d8._4_4_,local_1c8 + (float)local_1d8);
            uStack_470 = CONCAT44(fStack_1bc + uStack_1d0._4_4_,fStack_1c0 + (float)uStack_1d0);
            local_80 = local_3d8;
            local_98 = local_478;
            uStack_90 = uStack_470;
            *(undefined8 *)local_3d8 = local_478;
            *(undefined8 *)(local_3d8 + 2) = uStack_470;
            local_3d8 = local_3d8 + 4;
            local_1d8 = uVar4;
            uStack_1d0 = uVar5;
            local_158 = uVar2;
            uStack_150 = uVar3;
            local_148 = uVar6;
            uStack_140 = uVar7;
          }
        }
      }
    }
    local_254 = 0;
  }
  else if (local_284 == 3) {
    local_50c = local_278->w;
    local_510 = local_278->h;
    local_514 = local_278->c;
    local_518 = local_50c * local_510;
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) == 0) {
      local_598 = ncnn::Mat::operator_cast_to_float_(local_280);
      for (local_59c = 0; local_59c < local_514; local_59c = local_59c + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff9e8,(int)((ulong)in_stack_fffffffffffff9e0 >> 0x20)
                          );
        pfVar10 = ncnn::Mat::operator_cast_to_float_(&local_5f0);
        ncnn::Mat::~Mat((Mat *)0x504397);
        fVar1 = local_598[local_59c];
        local_5a8 = pfVar10;
        for (local_5f8 = local_518; 0 < local_5f8; local_5f8 = local_5f8 + -1) {
          *local_5a8 = fVar1 * *local_5a8;
          local_5a8 = local_5a8 + 1;
        }
      }
    }
    else {
      local_520 = ncnn::Mat::operator_cast_to_float_(local_280);
      local_528 = ncnn::Mat::operator_cast_to_float_
                            ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x120));
      for (local_52c = 0; local_52c < local_514; local_52c = local_52c + 1) {
        ncnn::Mat::channel(in_stack_fffffffffffff9e8,(int)((ulong)in_stack_fffffffffffff9e0 >> 0x20)
                          );
        pfVar10 = ncnn::Mat::operator_cast_to_float_(&local_580);
        ncnn::Mat::~Mat((Mat *)0x504235);
        local_584 = local_520[local_52c];
        local_588 = local_528[local_52c];
        local_538 = pfVar10;
        for (local_58c = local_518; 0 < local_58c; local_58c = local_58c + -1) {
          *local_538 = *local_538 * local_584 + local_588;
          local_538 = local_538 + 1;
        }
      }
    }
    local_254 = 0;
  }
  else {
    local_254 = Scale::forward_inplace
                          (in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,
                           in_stack_fffffffffffffb20);
  }
  return local_254;
}

Assistant:

int Scale_x86::forward_inplace(std::vector<Mat>& bottom_top_blobs, const Option& opt) const
{
    Mat& bottom_top_blob = bottom_top_blobs[0];
    const Mat& scale_blob = bottom_top_blobs[1];

    int dims = bottom_top_blob.dims;
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    __m256 _bias = _mm256_loadu_ps(bias + i * 8);
                    _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 8;

                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _s = _mm256_loadu_ps(scale + i * 8);
                    _p = _mm256_mul_ps(_p, _s);
                    _mm256_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + i * 8);

                    for (int j = 0; j < w; j++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);
                    __m256 _bias = _mm256_loadu_ps((const float*)bias_data + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m256 _s = _mm256_loadu_ps((const float*)scale_blob + q * 8);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _s);
                        _mm256_storeu_ps(ptr, _p);

                        ptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            const float* scale = scale_blob;
            if (bias_term)
            {
                const float* bias = bias_data;
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    __m128 _bias = _mm_loadu_ps(bias + i * 4);
                    _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                    _mm_storeu_ps(ptr, _p);
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    float* ptr = (float*)bottom_top_blob + i * 4;

                    __m128 _p = _mm_loadu_ps(ptr);
                    __m128 _s = _mm_loadu_ps(scale + i * 4);
                    _p = _mm_mul_ps(_p, _s);
                    _mm_storeu_ps(ptr, _p);
                }
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < h; i++)
                {
                    float* ptr = bottom_top_blob.row(i);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + i * 4);

                    for (int j = 0; j < w; j++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        if (dims == 3)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int channels = bottom_top_blob.c;
            int size = w * h;

            if (bias_term)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);
                    __m128 _bias = _mm_loadu_ps((const float*)bias_data + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_add_ps(_mm_mul_ps(_p, _s), _bias);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    float* ptr = bottom_top_blob.channel(q);
                    __m128 _s = _mm_loadu_ps((const float*)scale_blob + q * 4);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_loadu_ps(ptr);
                        _p = _mm_mul_ps(_p, _s);
                        _mm_storeu_ps(ptr, _p);

                        ptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3)
        return Scale::forward_inplace(bottom_top_blobs, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (bias_term)
    {
        const float* scale_ptr = scale_blob;
        const float* bias_ptr = bias_data;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];
            float bias = bias_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            __m256 _bias = _mm256_set1_ps(bias);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _s, _bias);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr = *ptr * s + bias;

                ptr++;
            }
        }
    }
    else
    {
        const float* scale_ptr = scale_blob;
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            float s = scale_ptr[q];

#if __AVX__
            int nn = size >> 3;
            int remain = size & 7;
#else
            int remain = size;
#endif // __AVX__

#if __AVX__
            __m256 _s = _mm256_set1_ps(s);
            for (; nn > 0; nn--)
            {
                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_mul_ps(_p, _s);
                _mm256_storeu_ps(ptr, _p);

                ptr += 8;
            }
#endif // __AVX__

            for (; remain > 0; remain--)
            {
                *ptr *= s;

                ptr++;
            }
        }
    }

    return 0;
}